

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

FaceHandle __thiscall OpenMesh::PolyConnectivity::remove_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  BaseHandle _fh;
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  HalfedgeHandle _nheh_00;
  VertexHandle _vh;
  VertexHandle _vh_00;
  BaseHandle _fh_00;
  HalfedgeHandle _heh_01;
  int iVar1;
  bool bVar2;
  reference pvVar3;
  Halfedge *pHVar4;
  Vertex *pVVar5;
  Face *pFVar6;
  BaseHandle BVar7;
  HalfedgeHandle _heh_02;
  undefined1 local_68 [8];
  FaceHalfedgeIter fh_it;
  
  pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  if (((pvVar3->status_ & 1) != 0) || (bVar2 = is_simple_link(this,_eh), !bVar2)) {
    __assert_fail("!status(_eh).deleted() && is_simple_link(_eh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x362,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                 );
  }
  _heh_01.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  _heh_02.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  BVar7.idx_ = (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _fh.idx_ = (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  _fh_00.idx_ = BVar7.idx_;
  if (_fh.idx_ == -1) {
    _fh_00.idx_ = -1;
    _fh.idx_ = BVar7.idx_;
  }
  if (_fh.idx_ == -1) {
    __assert_fail("del_fh.is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x36d,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                 );
  }
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar4->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _heh_00.super_BaseHandle.idx_ = (BaseHandle)(pHVar4->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _nheh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar4->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _nheh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar4->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh_00);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
       _heh_00.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh);
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar4->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _vh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar4->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pVVar5 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
       (int)_heh_02.super_BaseHandle.idx_;
  if ((BaseHandle)(pVVar5->halfedge_handle_).super_BaseHandle.idx_ == _heh_02.super_BaseHandle.idx_)
  {
    pVVar5 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
    (pVVar5->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
  }
  pVVar5 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
  if ((BaseHandle)(pVVar5->halfedge_handle_).super_BaseHandle.idx_ == _heh_01.super_BaseHandle.idx_)
  {
    pVVar5 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
    (pVVar5->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh_00.super_BaseHandle.idx_;
  }
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.idx_);
  iVar1 = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
  BVar7.idx_ = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
  if (((BaseHandle)(pFVar6->halfedge_handle_).super_BaseHandle.idx_ == _heh_01.super_BaseHandle.idx_
      ) || (pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.idx_),
           BVar7.idx_ = (int)_heh.super_BaseHandle.idx_,
           (pFVar6->halfedge_handle_).super_BaseHandle.idx_ == iVar1)) {
    pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.idx_);
    (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = BVar7.idx_;
  }
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.idx_);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pFVar6->halfedge_handle_).super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  bVar2 = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ == -1;
  local_68 = (undefined1  [8])this;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
  if (!bVar2) {
    do {
      if ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      if (bVar2) {
        __assert_fail("this->heh_.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/CirculatorsT.hh"
                      ,0x115,
                      "value_type OpenMesh::Iterators::GenericCirculatorT<OpenMesh::PolyConnectivity, OpenMesh::FaceHandle, OpenMesh::HalfedgeHandle, &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>::operator*() const [Mesh = OpenMesh::PolyConnectivity, CenterEntityHandle = OpenMesh::FaceHandle, ValueHandle = OpenMesh::HalfedgeHandle, Handle2Value = &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle]"
                     );
      }
      pHVar4 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh_00.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_68);
      bVar2 = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1;
    } while (!bVar2);
  }
  pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  *(byte *)&pvVar3->status_ = (byte)pvVar3->status_ | 1;
  pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).face_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (FaceHandle)_fh.idx_);
  *(byte *)&pvVar3->status_ = (byte)pvVar3->status_ | 1;
  return (BaseHandle)(BaseHandle)_fh_00.idx_;
}

Assistant:

PolyConnectivity::FaceHandle 
PolyConnectivity::remove_edge(EdgeHandle _eh)
{
  //don't allow "dangling" vertices and edges
  assert(!status(_eh).deleted() && is_simple_link(_eh));
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  
  //deal with the faces
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(del_fh.is_valid());
/*  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it; ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(fh_it, rem_fh);  
  } */
  //fix the halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, next_heh1);
  set_next_halfedge_handle(prev_heh1, next_heh0);
  //correct outgoing vertex handles for the _eh vertices (if needed)
  VertexHandle vh0 = to_vertex_handle(heh0);
  VertexHandle vh1 = to_vertex_handle(heh1);
  
  if (halfedge_handle(vh0) == heh1)
  {
    set_halfedge_handle(vh0, next_heh0);
  }
  if (halfedge_handle(vh1) == heh0)
  {
    set_halfedge_handle(vh1, next_heh1);
  }
  
  //correct the hafledge handle of rem_fh if needed and preserve its first vertex
  if (halfedge_handle(rem_fh) == heh0)
  {//rem_fh is the face at heh0
    set_halfedge_handle(rem_fh, prev_heh1);
  }
  else if (halfedge_handle(rem_fh) == heh1)
  {//rem_fh is the face at heh1
    set_halfedge_handle(rem_fh, prev_heh0);
  }
  for (FaceHalfedgeIter fh_it = fh_iter(rem_fh); fh_it.is_valid(); ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(*fh_it, rem_fh);
  } 
  
  status(_eh).set_deleted(true);  
  status(del_fh).set_deleted(true);  
  return rem_fh;//returns the remaining face handle
}